

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HeartGenerator.h
# Opt level: O0

void __thiscall soul::HEARTGenerator::visit(HEARTGenerator *this,Processor *p)

{
  ProcessorBase *pPVar1;
  bool bVar2;
  uint32_t uVar3;
  Expression *latency;
  StringDictionary *dictionary;
  ArrayView<soul::pool_ref<soul::AST::Function>_> local_80 [2];
  Annotation local_60;
  ArrayView<soul::pool_ref<soul::AST::StructDeclaration>_> local_30;
  pool_ptr<const_soul::AST::Processor> local_20;
  Processor *local_18;
  Processor *p_local;
  HEARTGenerator *this_local;
  
  local_18 = p;
  p_local = (Processor *)this;
  pool_ptr<soul::AST::Processor_const>::pool_ptr<soul::AST::Processor,void>
            ((pool_ptr<soul::AST::Processor_const> *)&local_20,p);
  (this->sourceProcessor).object = local_20.object;
  pool_ptr<const_soul::AST::Processor>::~pool_ptr(&local_20);
  bVar2 = pool_ptr<soul::AST::Expression>::operator!=(&local_18->latency,(void *)0x0);
  if (bVar2) {
    latency = pool_ptr<soul::AST::Expression>::operator*(&local_18->latency);
    uVar3 = SanityCheckPass::checkLatency(latency);
    this->module->latency = uVar3;
  }
  ArrayView<soul::pool_ref<soul::AST::StructDeclaration>>::
  ArrayView<std::vector<soul::pool_ref<soul::AST::StructDeclaration>,std::allocator<soul::pool_ref<soul::AST::StructDeclaration>>>>
            ((ArrayView<soul::pool_ref<soul::AST::StructDeclaration>> *)&local_30,
             &(local_18->super_ProcessorBase).super_ModuleBase.structures);
  generateStructs(this,local_30);
  pPVar1 = &local_18->super_ProcessorBase;
  dictionary = Program::getStringDictionary(&this->module->program);
  AST::Annotation::toPlainAnnotation(&local_60,&pPVar1->annotation,dictionary);
  Annotation::operator=(&this->module->annotation,&local_60);
  Annotation::~Annotation(&local_60);
  this->parsingStateVariables = true;
  ASTVisitor::visit(&this->super_ASTVisitor,local_18);
  this->parsingStateVariables = false;
  ArrayView<soul::pool_ref<soul::AST::Function>>::
  ArrayView<std::vector<soul::pool_ref<soul::AST::Function>,std::allocator<soul::pool_ref<soul::AST::Function>>>>
            ((ArrayView<soul::pool_ref<soul::AST::Function>> *)local_80,&local_18->functions);
  generateFunctions(this,local_80[0]);
  return;
}

Assistant:

void visit (AST::Processor& p) override
    {
        sourceProcessor = p;

        if (p.latency != nullptr)
            module.latency = SanityCheckPass::checkLatency (*p.latency);

        generateStructs (p.structures);

        module.annotation = p.annotation.toPlainAnnotation (module.program.getStringDictionary());

        parsingStateVariables = true;
        super::visit (p);
        parsingStateVariables = false;

        generateFunctions (p.functions);
    }